

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasMapFields(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *this;
  Descriptor *descriptor_00;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Descriptor *descriptor_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= local_1c) {
      local_20 = 0;
      while( true ) {
        iVar2 = Descriptor::nested_type_count(descriptor);
        if (iVar2 <= local_20) {
          return false;
        }
        descriptor_00 = Descriptor::nested_type(descriptor,local_20);
        bVar1 = HasMapFields(descriptor_00);
        if (bVar1) break;
        local_20 = local_20 + 1;
      }
      return true;
    }
    this = Descriptor::field(descriptor,local_1c);
    bVar1 = FieldDescriptor::is_map(this);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

static bool HasMapFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->is_map()) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasMapFields(descriptor->nested_type(i))) return true;
  }
  return false;
}